

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O2

ptr<Expression> __thiscall Parser::value(Parser *this)

{
  undefined4 uVar1;
  _Alloc_hider _Var2;
  bool bVar3;
  pointer pcVar4;
  undefined8 extraout_RAX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  Parser *in_RSI;
  string *unaff_R12;
  ptr<Expression> pVar6;
  initializer_list<TokenType> __l;
  bool logicalValue;
  undefined7 uStack_87;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_80;
  undefined1 local_78 [8];
  string sStack_70;
  double local_40;
  double doubleValue;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var5;
  
  _logicalValue = (pointer)0x3c0000003b;
  __l._M_len = 2;
  __l._M_array = (iterator)&logicalValue;
  std::vector<TokenType,_std::allocator<TokenType>_>::vector
            ((vector<TokenType,_std::allocator<TokenType>_> *)local_78,__l,
             (allocator_type *)&doubleValue);
  bVar3 = matchAny(in_RSI,(vector<TokenType,_std::allocator<TokenType>_> *)local_78);
  std::_Vector_base<TokenType,_std::allocator<TokenType>_>::~_Vector_base
            ((_Vector_base<TokenType,_std::allocator<TokenType>_> *)local_78);
  if (bVar3) {
    Token::Token((Token *)local_78,&in_RSI->currentToken);
    uVar1 = local_78._0_4_;
    std::__cxx11::string::~string((string *)(local_78 + 8));
    logicalValue = uVar1 == 0x3b;
    consume(in_RSI);
    std::make_shared<PrimitiveExpression<Boolean>,bool&>((bool *)local_78);
  }
  else {
    bVar3 = match(in_RSI,Number);
    if (bVar3) {
      Token::Token((Token *)local_78,&in_RSI->currentToken);
      pcVar4 = (pointer)std::__cxx11::stoll((string *)(local_78 + 8),(size_t *)0x0,10);
      std::__cxx11::string::~string((string *)(local_78 + 8));
      _logicalValue = pcVar4;
      Token::Token((Token *)local_78,&in_RSI->currentToken);
      local_40 = std::__cxx11::stod((string *)(local_78 + 8),(size_t *)0x0);
      std::__cxx11::string::~string((string *)(local_78 + 8));
      doubleValue = local_40;
      consume(in_RSI);
      if ((local_40 != (double)(long)pcVar4) || (NAN(local_40) || NAN((double)(long)pcVar4))) {
        std::make_shared<PrimitiveExpression<Double>,double&>((double *)local_78);
      }
      else {
        std::make_shared<PrimitiveExpression<Integer>,long_long&>((longlong *)local_78);
      }
    }
    else {
      bVar3 = match(in_RSI,SingleQuote);
      if (bVar3) {
        consume(in_RSI);
        Token::Token((Token *)local_78,&in_RSI->currentToken);
        std::make_shared<PrimitiveExpression<String>,std::__cxx11::string&>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &logicalValue);
        _Var5._M_pi = _Stack_80._M_pi;
        _Stack_80._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        (this->filepath)._M_dataplus._M_p = _logicalValue;
        (this->filepath)._M_string_length = (size_type)_Var5._M_pi;
        _logicalValue = (pointer)0x0;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_80);
        std::__cxx11::string::~string((string *)(local_78 + 8));
        consume(in_RSI,String,"string");
        consume(in_RSI,SingleQuote,"\"\'\"");
        _Var5._M_pi = extraout_RDX;
        goto LAB_0010e599;
      }
      bVar3 = match(in_RSI,DoubleQuote);
      if (bVar3) {
        consume(in_RSI);
        Token::Token((Token *)local_78,&in_RSI->currentToken);
        std::make_shared<PrimitiveExpression<String>,std::__cxx11::string&>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &logicalValue);
        _Var5._M_pi = _Stack_80._M_pi;
        _Stack_80._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        (this->filepath)._M_dataplus._M_p = _logicalValue;
        (this->filepath)._M_string_length = (size_type)_Var5._M_pi;
        _logicalValue = (pointer)0x0;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_80);
        std::__cxx11::string::~string((string *)(local_78 + 8));
        consume(in_RSI,String,"string");
        consume(in_RSI,DoubleQuote,"\'\"\'");
        _Var5._M_pi = extraout_RDX_00;
        goto LAB_0010e599;
      }
      bVar3 = match(in_RSI,LeftCurly);
      if (bVar3) {
        object((Parser *)local_78);
      }
      else {
        bVar3 = match(in_RSI,LeftBrack);
        if (!bVar3) {
          bVar3 = match(in_RSI,Lambda);
          if (!bVar3) {
            unexpected(in_RSI);
            std::__cxx11::string::~string(unaff_R12);
            _Unwind_Resume(extraout_RAX);
          }
          pVar6 = lambda(this);
          _Var5 = pVar6.super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
          ;
          goto LAB_0010e599;
        }
        array((Parser *)local_78);
      }
    }
  }
  _Var2._M_p = sStack_70._M_dataplus._M_p;
  sStack_70._M_dataplus._M_p = (pointer)0x0;
  (this->filepath)._M_dataplus._M_p = (pointer)local_78;
  (this->filepath)._M_string_length = (size_type)_Var2._M_p;
  local_78 = (undefined1  [8])0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_78 + 8));
  _Var5._M_pi = extraout_RDX_01;
LAB_0010e599:
  pVar6.super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var5._M_pi;
  pVar6.super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (ptr<Expression>)pVar6.super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ptr<Expression> Parser::value() {
    if(matchAny({ TokenType::True, TokenType::False })) {
        bool logicalValue = token().type == TokenType::True;
        consume();
        return make<PrimitiveExpression<Boolean>>(logicalValue);

    } else if(match(TokenType::Number)) {
        long long int integerValue = std::stoll(token().lexeme);
        double doubleValue = std::stod(token().lexeme);
        consume();

        if(integerValue == doubleValue) {
            return make<PrimitiveExpression<Integer>>(integerValue);
        }

        return make<PrimitiveExpression<Double>>(doubleValue);

    } else if(match(TokenType::SingleQuote)) {
        consume();
        ptr<Expression> expr = make<PrimitiveExpression<String>>(token().lexeme);
        consume(TokenType::String, "string");
        consume(TokenType::SingleQuote, "\"'\"");
        return expr;

    } else if(match(TokenType::DoubleQuote)) {
        consume();
        ptr<Expression> expr = make<PrimitiveExpression<String>>(token().lexeme);
        consume(TokenType::String, "string");
        consume(TokenType::DoubleQuote, "'\"'");
        return expr;

    } else if(match(TokenType::LeftCurly)) {
        return object();
    } else if(match(TokenType::LeftBrack)) {
        return array();
    } else if(match(TokenType::Lambda)) {
        return lambda();
    } else {
        unexpected();
    }
}